

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation.cpp
# Opt level: O0

value * __thiscall
mjs::value_representation::get_value
          (value *__return_storage_ptr__,value_representation *this,gc_heap *heap)

{
  bool bVar1;
  wostream *pwVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  wstring local_218 [32];
  wstring_view local_1f8;
  wostringstream local_1e8 [8];
  wostringstream woss;
  gc_heap_ptr<mjs::object> local_70 [2];
  undefined1 local_50 [32];
  uint local_30;
  value_type local_2c;
  uint32_t payload;
  value_type type;
  double d;
  gc_heap *heap_local;
  value_representation *this_local;
  
  d = (double)heap;
  heap_local = (gc_heap *)this;
  this_local = (value_representation *)__return_storage_ptr__;
  bVar1 = is_special(this->repr_);
  if (bVar1) {
    local_2c = type_from_repr(this->repr_);
    local_30 = (uint)this->repr_;
    switch(local_2c) {
    case undefined:
      if (local_30 != 0) {
        __assert_fail("!payload",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                      ,0x45,"value mjs::value_representation::get_value(gc_heap &) const");
      }
      value::value(__return_storage_ptr__,(value *)value::undefined);
      break;
    case null:
      if (local_30 != 0) {
        __assert_fail("!payload",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                      ,0x46,"value mjs::value_representation::get_value(gc_heap &) const");
      }
      value::value(__return_storage_ptr__,(value *)value::null);
      break;
    case boolean:
      if (1 < local_30) {
        __assert_fail("payload == 0 || payload == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                      ,0x47,"value mjs::value_representation::get_value(gc_heap &) const");
      }
      value::value(__return_storage_ptr__,local_30 != 0);
      break;
    case number:
    default:
      std::__cxx11::wostringstream::wostringstream(local_1e8);
      pwVar2 = std::operator<<((wostream *)local_1e8,"Not handled: ");
      pbVar3 = mjs::operator<<(pwVar2,local_2c);
      pwVar2 = std::operator<<(pbVar3," ");
      std::wostream::operator<<(pwVar2,this->repr_);
      std::__cxx11::wostringstream::str();
      local_1f8 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_218)
      ;
      throw_runtime_error(&local_1f8,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                          ,0x4f);
    case string:
      gc_heap::unsafe_create_from_position<mjs::gc_string>((gc_heap *)local_50,SUB84(d,0));
      string::string((string *)(local_50 + 0x10),(gc_heap_ptr<mjs::gc_string> *)local_50);
      value::value(__return_storage_ptr__,(string *)(local_50 + 0x10));
      string::~string((string *)(local_50 + 0x10));
      gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr((gc_heap_ptr<mjs::gc_string> *)local_50);
      break;
    case object:
      gc_heap::unsafe_create_from_position<mjs::object>((gc_heap *)local_70,SUB84(d,0));
      value::value(__return_storage_ptr__,(object_ptr *)local_70);
      gc_heap_ptr<mjs::object>::~gc_heap_ptr(local_70);
    }
  }
  else {
    _payload = (pointer)this->repr_;
    value::value(__return_storage_ptr__,(double)_payload);
  }
  return __return_storage_ptr__;
}

Assistant:

value value_representation::get_value(gc_heap& heap) const {
    if (!is_special(repr_)) {
        double d;
        static_assert(sizeof(d) == sizeof(repr_));
        std::memcpy(&d, &repr_, sizeof(d));
        return value{d};
    }
    const auto type    = type_from_repr(repr_);
    const auto payload = static_cast<uint32_t>(repr_);
    switch (type) {
    case value_type::undefined: assert(!payload); return value::undefined;
    case value_type::null:      assert(!payload); return value::null;
    case value_type::boolean:   assert(payload == 0 || payload == 1); return value{!!payload};
    case value_type::number:    /*should be handled above*/ break;
    case value_type::string:    return value{string{heap.unsafe_create_from_position<gc_string>(payload)}};
    case value_type::object:    return value{heap.unsafe_create_from_position<object>(payload)};
    default:                    break;
    }
    std::wostringstream woss;
    woss << "Not handled: " << type << " " << repr_;
    THROW_RUNTIME_ERROR(woss.str());
}